

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::
         format<std::__cxx11::string,unsigned_int,unsigned_long,unsigned_long,unsigned_int>
                   (char *fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   uint *args_1,unsigned_long *args_2,unsigned_long *args_3,uint *args_4)

{
  long lVar1;
  string *in_RDI;
  ostream *in_R9;
  long in_FS_OFFSET;
  ostringstream oss;
  string *args_2_00;
  ostringstream *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  ostringstream local_180 [112];
  uint *in_stack_fffffffffffffef0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_180;
  args_2_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(this);
  format<std::__cxx11::string,unsigned_int,unsigned_long,unsigned_long,unsigned_int>
            (in_R9,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(uint *)this,
             (unsigned_long *)args_2_00,(unsigned_long *)in_RDI,in_stack_fffffffffffffef0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return args_2_00;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}